

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brkeng.cpp
# Opt level: O2

LanguageBreakEngine * __thiscall
icu_63::ICULanguageBreakFactory::loadEngineFor(ICULanguageBreakFactory *this,UChar32 c)

{
  UScriptCode UVar1;
  int iVar2;
  undefined4 extraout_var;
  ThaiBreakEngine *this_00;
  size_t size;
  UErrorCode status;
  ThaiBreakEngine *adoptDictionary;
  
  status = U_ZERO_ERROR;
  UVar1 = uscript_getScript_63(c,&status);
  if (U_ZERO_ERROR < status) {
    return (LanguageBreakEngine *)0x0;
  }
  size = (size_t)(uint)UVar1;
  iVar2 = (*(this->super_LanguageBreakFactory)._vptr_LanguageBreakFactory[4])(this);
  adoptDictionary = (ThaiBreakEngine *)CONCAT44(extraout_var,iVar2);
  if (adoptDictionary == (ThaiBreakEngine *)0x0) {
    return (LanguageBreakEngine *)0x0;
  }
  switch(UVar1) {
  case USCRIPT_HAN:
  case USCRIPT_HIRAGANA:
  case USCRIPT_KATAKANA:
    this_00 = (ThaiBreakEngine *)UMemory::operator_new((UMemory *)0x1d0,size);
    if (this_00 == (ThaiBreakEngine *)0x0) goto switchD_002cf110_caseD_13;
    CjkBreakEngine::CjkBreakEngine
              ((CjkBreakEngine *)this_00,(DictionaryMatcher *)adoptDictionary,kChineseJapanese,
               &status);
    break;
  case USCRIPT_HANGUL:
    this_00 = (ThaiBreakEngine *)UMemory::operator_new((UMemory *)0x1d0,size);
    if (this_00 == (ThaiBreakEngine *)0x0) goto switchD_002cf110_caseD_13;
    CjkBreakEngine::CjkBreakEngine
              ((CjkBreakEngine *)this_00,(DictionaryMatcher *)adoptDictionary,kKorean,&status);
    break;
  case USCRIPT_HEBREW:
  case USCRIPT_KANNADA:
  case USCRIPT_LATIN:
  case USCRIPT_MALAYALAM:
  case USCRIPT_MONGOLIAN:
    goto switchD_002cf110_caseD_13;
  case USCRIPT_KHMER:
    this_00 = (ThaiBreakEngine *)UMemory::operator_new((UMemory *)0x1c8,size);
    if (this_00 == (ThaiBreakEngine *)0x0) goto switchD_002cf110_caseD_13;
    KhmerBreakEngine::KhmerBreakEngine
              ((KhmerBreakEngine *)this_00,(DictionaryMatcher *)adoptDictionary,&status);
    break;
  case USCRIPT_LAO:
    this_00 = (ThaiBreakEngine *)UMemory::operator_new((UMemory *)0x1c8,size);
    if (this_00 == (ThaiBreakEngine *)0x0) goto switchD_002cf110_caseD_13;
    LaoBreakEngine::LaoBreakEngine
              ((LaoBreakEngine *)this_00,(DictionaryMatcher *)adoptDictionary,&status);
    break;
  case USCRIPT_MYANMAR:
    this_00 = (ThaiBreakEngine *)UMemory::operator_new((UMemory *)0x1c8,size);
    if (this_00 == (ThaiBreakEngine *)0x0) goto switchD_002cf110_caseD_13;
    BurmeseBreakEngine::BurmeseBreakEngine
              ((BurmeseBreakEngine *)this_00,(DictionaryMatcher *)adoptDictionary,&status);
    break;
  default:
    if ((UVar1 != USCRIPT_THAI) ||
       (this_00 = (ThaiBreakEngine *)UMemory::operator_new((UMemory *)0x220,size),
       this_00 == (ThaiBreakEngine *)0x0)) goto switchD_002cf110_caseD_13;
    ThaiBreakEngine::ThaiBreakEngine(this_00,(DictionaryMatcher *)adoptDictionary,&status);
  }
  adoptDictionary = this_00;
  if (status < U_ILLEGAL_ARGUMENT_ERROR) {
    return (LanguageBreakEngine *)this_00;
  }
switchD_002cf110_caseD_13:
  (*(adoptDictionary->super_DictionaryBreakEngine).super_LanguageBreakEngine.
    _vptr_LanguageBreakEngine[1])(adoptDictionary);
  return (LanguageBreakEngine *)0x0;
}

Assistant:

const LanguageBreakEngine *
ICULanguageBreakFactory::loadEngineFor(UChar32 c) {
    UErrorCode status = U_ZERO_ERROR;
    UScriptCode code = uscript_getScript(c, &status);
    if (U_SUCCESS(status)) {
        DictionaryMatcher *m = loadDictionaryMatcherFor(code);
        if (m != NULL) {
            const LanguageBreakEngine *engine = NULL;
            switch(code) {
            case USCRIPT_THAI:
                engine = new ThaiBreakEngine(m, status);
                break;
            case USCRIPT_LAO:
                engine = new LaoBreakEngine(m, status);
                break;
            case USCRIPT_MYANMAR:
                engine = new BurmeseBreakEngine(m, status);
                break;
            case USCRIPT_KHMER:
                engine = new KhmerBreakEngine(m, status);
                break;

#if !UCONFIG_NO_NORMALIZATION
                // CJK not available w/o normalization
            case USCRIPT_HANGUL:
                engine = new CjkBreakEngine(m, kKorean, status);
                break;

            // use same BreakEngine and dictionary for both Chinese and Japanese
            case USCRIPT_HIRAGANA:
            case USCRIPT_KATAKANA:
            case USCRIPT_HAN:
                engine = new CjkBreakEngine(m, kChineseJapanese, status);
                break;
#if 0
            // TODO: Have to get some characters with script=common handled
            // by CjkBreakEngine (e.g. U+309B). Simply subjecting
            // them to CjkBreakEngine does not work. The engine has to
            // special-case them.
            case USCRIPT_COMMON:
            {
                UBlockCode block = ublock_getCode(code);
                if (block == UBLOCK_HIRAGANA || block == UBLOCK_KATAKANA)
                   engine = new CjkBreakEngine(dict, kChineseJapanese, status);
                break;
            }
#endif
#endif

            default:
                break;
            }
            if (engine == NULL) {
                delete m;
            }
            else if (U_FAILURE(status)) {
                delete engine;
                engine = NULL;
            }
            return engine;
        }
    }
    return NULL;
}